

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O0

undefined8 __thiscall
bgui::ImageAdapter<float>::getDescriptionOfPixel_abi_cxx11_(ImageAdapter<float> *this,long x,long y)

{
  Image<float,_gimage::PixelTraits<float>_> *this_00;
  long i;
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  work_t wVar4;
  int d;
  SVector<long,_2> p;
  ostringstream os;
  SVector<long,_3> *in_stack_fffffffffffffe00;
  SMatrix<long,_2,_3> *in_stack_fffffffffffffe08;
  int local_1d0;
  SVector<long,_3> local_1c0;
  SVector<long,_2> local_1a8;
  long local_198 [47];
  long local_20;
  long local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  local_18 = (long)((double)local_18 / *(double *)(in_RSI + 0x48));
  local_20 = (long)((double)local_20 / *(double *)(in_RSI + 0x48));
  gmath::SVector<long,_3>::SVector(&local_1c0,local_18,local_20,1);
  gmath::SMatrix<long,_2,_3>::operator*(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::operator<<((ostream *)local_198,"x=");
  std::ios_base::width((ios_base *)((long)local_198 + *(long *)(local_198[0] + -0x18)),5);
  plVar2 = gmath::SVector<long,_2>::operator[](&local_1a8,0);
  poVar3 = (ostream *)std::ostream::operator<<(local_198,*plVar2);
  std::operator<<(poVar3,", y=");
  std::ios_base::width((ios_base *)((long)local_198 + *(long *)(local_198[0] + -0x18)),5);
  plVar2 = gmath::SVector<long,_2>::operator[](&local_1a8,1);
  poVar3 = (ostream *)std::ostream::operator<<(local_198,*plVar2);
  std::operator<<(poVar3,":");
  local_1d0 = 0;
  while( true ) {
    iVar1 = gimage::Image<float,_gimage::PixelTraits<float>_>::getDepth
                      (*(Image<float,_gimage::PixelTraits<float>_> **)(in_RSI + 0x70));
    if (iVar1 <= local_1d0) break;
    std::operator<<((ostream *)local_198," ");
    std::ios_base::width((ios_base *)((long)local_198 + *(long *)(local_198[0] + -0x18)),5);
    this_00 = *(Image<float,_gimage::PixelTraits<float>_> **)(in_RSI + 0x70);
    plVar2 = gmath::SVector<long,_2>::operator[](&local_1a8,0);
    i = *plVar2;
    plVar2 = gmath::SVector<long,_2>::operator[](&local_1a8,1);
    wVar4 = gimage::Image<float,_gimage::PixelTraits<float>_>::getW(this_00,i,*plVar2,local_1d0);
    std::ostream::operator<<(local_198,wVar4);
    local_1d0 = local_1d0 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return in_RDI;
}

Assistant:

std::string getDescriptionOfPixel(long x, long y) const
    {
      std::ostringstream os;

      x=static_cast<long>(x/scale);
      y=static_cast<long>(y/scale);

      gmath::SVector<long, 2> p=R*gmath::SVector<long, 3>(x, y, 1);

      os << "x=";

      os.width(5);
      os << p[0] << ", y=";

      os.width(5);
      os << p[1] << ":";

      for (int d=0; d<image->getDepth(); d++)
      {
        os << " ";

        os.width(5);
        os << image->getW(p[0], p[1], d);
      }

      return os.str();
    }